

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int llhttp_should_keep_alive(llhttp_t *parser)

{
  int iVar1;
  llhttp_t *in_RDI;
  
  if ((in_RDI->http_major == '\0') || (in_RDI->http_minor == '\0')) {
    if ((in_RDI->flags & 1) == 0) {
      return 0;
    }
  }
  else if ((in_RDI->flags & 2) != 0) {
    return 0;
  }
  iVar1 = llhttp_message_needs_eof(in_RDI);
  return (uint)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

int llhttp_should_keep_alive(const llhttp_t* parser) {
  if (parser->http_major > 0 && parser->http_minor > 0) {
    /* HTTP/1.1 */
    if (parser->flags & F_CONNECTION_CLOSE) {
      return 0;
    }
  } else {
    /* HTTP/1.0 or earlier */
    if (!(parser->flags & F_CONNECTION_KEEP_ALIVE)) {
      return 0;
    }
  }

  return !llhttp_message_needs_eof(parser);
}